

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::argument_incorrect_type::~argument_incorrect_type(argument_incorrect_type *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this);
  return;
}

Assistant:

argument_incorrect_type(const std::string &arg)
      : OptionParseException("Argument " + LQUOTE + arg + RQUOTE +
                             " failed to parse") {}